

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O1

int si9ma::DP::find_way_recursive(int *arr,int length,int start,int aim,int step)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  while( true ) {
    iVar4 = start;
    uVar1 = 0;
    if ((((arr == (int *)0x0) || (iVar4 < 0)) || (length <= aim)) ||
       ((length <= iVar4 || (aim < 0)))) goto LAB_0010e509;
    if (step == 0) break;
    step = step + -1;
    if (iVar4 == 0) {
      start = 1;
    }
    else {
      start = length + -2;
      if (length + -1 != iVar4) {
        iVar2 = find_way_recursive(arr,length,iVar4 + 1,aim,step);
        iVar3 = iVar3 + iVar2;
        start = iVar4 + -1;
      }
    }
  }
  uVar1 = (uint)(iVar4 == aim);
LAB_0010e509:
  return iVar3 + uVar1;
}

Assistant:

int DP::find_way_recursive(const int *arr, int length,int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        if(step == 0)
            return start == aim;

        if(start == 0)
            return find_way_recursive(arr,length,1,aim,step - 1);

        if(start == length - 1)
            return find_way_recursive(arr,length,length - 2,aim,step - 1);

        return find_way_recursive(arr,length,start + 1,aim,step - 1)
               + find_way_recursive(arr,length,start - 1,aim,step - 1);
    }